

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_functions.hpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::VariableReturnBindData::Deserialize
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  _func_int **local_30;
  LogicalType stype;
  
  Deserializer::ReadProperty<duckdb::LogicalType>
            (&stype,(Deserializer *)bound_function,100,"variable_return_type");
  make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType>((duckdb *)&local_30,&stype);
  deserializer->_vptr_Deserializer = local_30;
  LogicalType::~LogicalType(&stype);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "variable_return_type");
		return make_uniq<VariableReturnBindData>(std::move(stype));
	}